

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::StoreSceneLights(ColladaLoader *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiLight **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  sVar3 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->mLights);
  pScene->mNumLights = (uint)sVar3;
  bVar2 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::empty(&this->mLights);
  if (!bVar2) {
    sVar3 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->mLights);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiLight **)operator_new__(uVar4);
    pScene->mLights = ppaVar5;
    __first = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::begin(&this->mLights);
    __last = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::end(&this->mLights);
    std::
    copy<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,aiLight**>
              ((__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __last._M_current,pScene->mLights);
    std::vector<aiLight_*,_std::allocator<aiLight_*>_>::clear(&this->mLights);
  }
  return;
}

Assistant:

void ColladaLoader::StoreSceneLights( aiScene* pScene) {
    pScene->mNumLights = static_cast<unsigned int>(mLights.size());
    if( mLights.empty() ) {
        return;
    }
    pScene->mLights = new aiLight*[mLights.size()];
    std::copy( mLights.begin(), mLights.end(), pScene->mLights);
    mLights.clear();
}